

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigApi.c
# Opt level: O0

Fraig_Node_t * Fraig_NodeMux(Fraig_Man_t *p,Fraig_Node_t *pC,Fraig_Node_t *pT,Fraig_Node_t *pE)

{
  Fraig_Node_t *pFVar1;
  Fraig_Node_t *p2;
  Fraig_Node_t *pRes;
  Fraig_Node_t *pAnd2;
  Fraig_Node_t *pAnd1;
  Fraig_Node_t *pE_local;
  Fraig_Node_t *pT_local;
  Fraig_Node_t *pC_local;
  Fraig_Man_t *p_local;
  
  pFVar1 = Fraig_NodeAndCanon(p,pC,pT);
  p2 = Fraig_NodeAndCanon(p,(Fraig_Node_t *)((ulong)pC ^ 1),pE);
  pFVar1 = Fraig_NodeOr(p,pFVar1,p2);
  return pFVar1;
}

Assistant:

Fraig_Node_t * Fraig_NodeMux( Fraig_Man_t * p, Fraig_Node_t * pC, Fraig_Node_t * pT, Fraig_Node_t * pE )
{
    Fraig_Node_t * pAnd1, * pAnd2, * pRes;
    pAnd1 = Fraig_NodeAndCanon( p, pC,          pT );     Fraig_Ref( pAnd1 );
    pAnd2 = Fraig_NodeAndCanon( p, Fraig_Not(pC), pE );   Fraig_Ref( pAnd2 );
    pRes  = Fraig_NodeOr( p, pAnd1, pAnd2 ); 
    Fraig_RecursiveDeref( p, pAnd1 );
    Fraig_RecursiveDeref( p, pAnd2 );
    Fraig_Deref( pRes );
    return pRes;
}